

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_8873c5::TransformSelectorFor::TransformSelectorFor
          (TransformSelectorFor *this,index_type start,index_type stop,index_type step)

{
  allocator<char> local_49;
  string local_48;
  index_type local_28;
  index_type step_local;
  index_type stop_local;
  index_type start_local;
  TransformSelectorFor *this_local;
  
  local_28 = step;
  step_local = stop;
  stop_local = start;
  start_local = (index_type)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"FOR",&local_49);
  TransformSelectorIndexes::TransformSelectorIndexes
            (&this->super_TransformSelectorIndexes,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  (this->super_TransformSelectorIndexes).super_TransformSelector.super_TransformSelector.
  _vptr_TransformSelector = (_func_int **)&PTR__TransformSelectorFor_017d4b10;
  this->Start = stop_local;
  this->Stop = step_local;
  this->Step = local_28;
  return;
}

Assistant:

TransformSelectorFor(index_type start, index_type stop, index_type step)
    : TransformSelectorIndexes("FOR")
    , Start(start)
    , Stop(stop)
    , Step(step)
  {
  }